

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall
getfrom_reader::perform(getfrom_reader *this,filesystemcollection *fslist,readercollection *rdlist)

{
  FileReader *__p;
  undefined8 *puVar1;
  ReadWriter_ptr w;
  ReadWriter_ptr rd;
  shared_ptr<ReadWriter> local_48;
  FileReader *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  ReadWriter *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  if (1 < g_verbose) {
    printf("dogetbytes(%s, %08llx, %08zx)\n",(this->_readername)._M_dataplus._M_p,this->_ofs,
           this->_n);
  }
  readercollection::getbyname((readercollection *)&local_28,(string *)rdlist);
  if (local_28 != (ReadWriter *)0x0) {
    (*local_28->_vptr_ReadWriter[4])(local_28,this->_ofs);
    __p = (FileReader *)operator_new(0x40);
    FileReader::FileReader(__p,&this->_savename);
    local_38 = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FileReader*>(&local_30,__p);
    local_48.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_38->super_ReadWriter;
    local_48.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_30._M_pi;
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      }
    }
    ReadWriter::copyto<std::shared_ptr<ReadWriter>>(local_28,&local_48,this->_n);
    if (local_48.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
    }
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "getfrom: invalid rdname";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        if (g_verbose>1)
            printf("dogetbytes(%s, %08llx, %08zx)\n", _readername.c_str(), _ofs, _n);

        ReadWriter_ptr rd= rdlist.getbyname(_readername);
        if (!rd) throw "getfrom: invalid rdname";

        rd->setpos(_ofs);

        ReadWriter_ptr w(new FileReader(_savename, FileReader::createnew));

        rd->copyto(w, _n);
    }